

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::dtime_tz_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::MinutesOperator>
               (dtime_tz_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t iVar14;
  ulong uVar15;
  ulong uVar16;
  unsigned_long uVar17;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar14 = 0;
      do {
        uVar11 = ldata[iVar14].bits >> 0x18;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar11;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar11 + (ulong)(SUB164(auVar2 * ZEXT816(0x262d6fcb01),8) >> 5) * -3600000000
        ;
        result_data[iVar14] = SUB168(auVar3 * ZEXT816(0x4795319ca2),8);
        iVar14 = iVar14 + 1;
      } while (count != iVar14);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var9 = p_Stack_40;
      peVar8 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar8;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var9;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data)
      ;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar10->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      uVar16 = 0;
      uVar11 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar17 = 0xffffffffffffffff;
        }
        else {
          uVar17 = puVar1[uVar16];
        }
        uVar13 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar13 = count;
        }
        uVar15 = uVar13;
        if (uVar17 != 0) {
          uVar15 = uVar11;
          if (uVar17 == 0xffffffffffffffff) {
            if (uVar11 < uVar13) {
              do {
                uVar11 = ldata[uVar15].bits >> 0x18;
                auVar4._8_8_ = 0;
                auVar4._0_8_ = uVar11;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = uVar11 + (ulong)(SUB164(auVar4 * ZEXT816(0x262d6fcb01),8) >> 5) *
                                        -3600000000;
                result_data[uVar15] = SUB168(auVar5 * ZEXT816(0x4795319ca2),8);
                uVar15 = uVar15 + 1;
              } while (uVar13 != uVar15);
            }
          }
          else if (uVar11 < uVar13) {
            uVar15 = 0;
            do {
              if ((uVar17 >> (uVar15 & 0x3f) & 1) != 0) {
                uVar12 = ldata[uVar11 + uVar15].bits >> 0x18;
                auVar6._8_8_ = 0;
                auVar6._0_8_ = uVar12;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = uVar12 + (ulong)(SUB164(auVar6 * ZEXT816(0x262d6fcb01),8) >> 5) *
                                        -3600000000;
                result_data[uVar11 + uVar15] = SUB168(auVar7 * ZEXT816(0x4795319ca2),8);
              }
              uVar15 = uVar15 + 1;
            } while ((uVar11 - uVar13) + uVar15 != 0);
            uVar15 = uVar11 + uVar15;
          }
        }
        uVar16 = uVar16 + 1;
        uVar11 = uVar15;
      } while (uVar16 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}